

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O1

void __thiscall
GlobOpt::ProcessValueKillsForLoopHeaderAfterBackEdgeMerge
          (GlobOpt *this,BasicBlock *block,GlobOptBlockData *blockData)

{
  ValueType *this_00;
  BaseHashSet<Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Value_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  *dictionary;
  Value *value;
  code *pcVar1;
  undefined8 this_01;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  ValueType newValueType;
  undefined4 *puVar5;
  EntryType *pEVar6;
  ArrayValueInfo *pAVar7;
  ValueInfo *pVVar8;
  undefined1 local_90 [8];
  BucketEntryIterator<JsUtil::BaseHashSet<Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Value_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
  it;
  anon_union_1_2_471f577c_for_JsArrayKills_0 local_31 [8];
  JsArrayKills loopKills;
  
  if (block == (BasicBlock *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x3415,"(block)","block");
    if (!bVar2) goto LAB_0046e4f4;
    *puVar5 = 0;
  }
  if ((block->field_0x18 & 4) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x3416,"(block->isLoopHeader)","block->isLoopHeader");
    if (!bVar2) goto LAB_0046e4f4;
    *puVar5 = 0;
  }
  if (blockData == (GlobOptBlockData *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x3417,"(blockData)","blockData");
    if (!bVar2) {
LAB_0046e4f4:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  dictionary = blockData->valuesToKillOnCalls;
  if ((dictionary->
      super_BaseDictionary<Value_*,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
      ).count !=
      (dictionary->
      super_BaseDictionary<Value_*,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
      ).freeCount) {
    local_31[0] = (block->loop->jsArrayKills).field_0;
    JsUtil::
    BaseDictionary<Value_*,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
    ::
    BucketEntryIterator<JsUtil::BaseHashSet<Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Value_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
    ::BucketEntryIterator
              ((BucketEntryIterator<JsUtil::BaseHashSet<Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Value_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
                *)local_90,dictionary);
    bVar2 = JsUtil::
            BaseDictionary<Value_*,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
            ::
            BucketEntryIterator<JsUtil::BaseHashSet<Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Value_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
            ::IsValid((BucketEntryIterator<JsUtil::BaseHashSet<Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Value_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
                       *)local_90);
    if (bVar2) {
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      do {
        pEVar6 = JsUtil::
                 BaseDictionary<Value_*,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                 ::
                 IteratorBase<JsUtil::BaseHashSet<Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Value_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<Value_*,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>::BucketEntryIterator<JsUtil::BaseHashSet<Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Value_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>_>
                 ::Current((IteratorBase<JsUtil::BaseHashSet<Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Value_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<Value_*,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>::BucketEntryIterator<JsUtil::BaseHashSet<Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Value_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>_>
                            *)local_90);
        value = (pEVar6->
                super_DefaultHashedEntry<Value_*,_Value_*,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
                ).super_ImplicitKeyValueEntry<Value_*,_Value_*>.
                super_ValueEntry<Value_*,_JsUtil::(anonymous_namespace)::ValueEntryData<Value_*>_>.
                super_ValueEntryData<Value_*>.value;
        pVVar8 = value->valueInfo;
        this_00 = &pVVar8->super_ValueType;
        bVar2 = ValueType::IsArrayOrObjectWithArray(this_00);
        if (((!bVar2) && (bVar2 = ValueType::IsOptimizedVirtualTypedArray(this_00), !bVar2)) &&
           ((bVar2 = ValueType::IsOptimizedTypedArray(this_00), !bVar2 ||
            (pAVar7 = ValueInfo::AsArrayValueInfo(pVVar8),
            pAVar7->headSegmentLengthSym == (StackSym *)0x0)))) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar5 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                             ,0x3427,
                             "(valueInfo->IsArrayOrObjectWithArray() || valueInfo->IsOptimizedVirtualTypedArray() || valueInfo->IsOptimizedTypedArray() && valueInfo->AsArrayValueInfo()->HeadSegmentLengthSym())"
                             ,
                             "valueInfo->IsArrayOrObjectWithArray() || valueInfo->IsOptimizedVirtualTypedArray() || valueInfo->IsOptimizedTypedArray() && valueInfo->AsArrayValueInfo()->HeadSegmentLengthSym()"
                            );
          if (!bVar2) goto LAB_0046e4f4;
          *puVar5 = 0;
        }
        it._56_8_ = pVVar8;
        bVar2 = ValueType::IsArrayOrObjectWithArray(this_00);
        bVar3 = ValueType::IsOptimizedTypedArray(this_00);
        if (bVar2 == bVar3) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar5 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                             ,0x342a,"(!isJsArray == valueInfo->IsOptimizedTypedArray())",
                             "!isJsArray == valueInfo->IsOptimizedTypedArray()");
          if (!bVar3) goto LAB_0046e4f4;
          *puVar5 = 0;
        }
        bVar3 = ValueType::IsOptimizedVirtualTypedArray(this_00);
        if (bVar3 || bVar2) {
          bVar4 = JsArrayKills::KillsValueType
                            ((JsArrayKills *)&local_31[0].field_0,
                             (ValueType)
                             *(anon_union_2_4_ea848c7b_for_ValueType_13 *)
                              &(this_00->field_0).field_0);
          if (bVar4) goto LAB_0046e3d8;
LAB_0046e394:
          this_01 = it._56_8_;
          if ((bVar2) && (bVar2 = ValueInfo::IsArrayValueInfo((ValueInfo *)it._56_8_), bVar2)) {
            pAVar7 = ValueInfo::AsArrayValueInfo((ValueInfo *)this_01);
            if ((local_31[0].bits & 0x10) == 0) {
              bVar2 = false;
            }
            else {
              bVar2 = pAVar7->headSegmentSym != (StackSym *)0x0;
            }
            if ((local_31[0].bits & 0x20) == 0) {
              bVar3 = false;
            }
            else {
              bVar3 = pAVar7->headSegmentLengthSym != (StackSym *)0x0;
            }
            if ((local_31[0].bits & 0x40) == 0) {
              bVar4 = false;
            }
            else {
              bVar4 = pAVar7->lengthSym != (StackSym *)0x0;
            }
            if ((byte)(bVar2 | bVar3 | bVar4) == 1) {
              pVVar8 = ArrayValueInfo::Copy
                                 (pAVar7,this->alloc,(bool)(bVar2 ^ 1),(bool)(bVar3 ^ 1),
                                  (bool)(bVar4 ^ 1));
              ChangeValueInfo(this,(BasicBlock *)0x0,value,pVVar8,false,false);
            }
          }
        }
        else {
          if ((local_31[0].bits & 1) == 0) goto LAB_0046e394;
LAB_0046e3d8:
          if (bVar3 || bVar2) {
            newValueType = ValueType::ToLikely(this_00);
            ChangeValueType(this,(BasicBlock *)0x0,value,newValueType,false,false);
          }
          else {
            pAVar7 = ValueInfo::AsArrayValueInfo((ValueInfo *)it._56_8_);
            pVVar8 = ArrayValueInfo::Copy(pAVar7,this->alloc,true,false,true);
            ChangeValueInfo(this,(BasicBlock *)0x0,value,pVVar8,false,false);
          }
          JsUtil::
          BaseDictionary<Value_*,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
          ::
          BucketEntryIterator<JsUtil::BaseHashSet<Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Value_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
          ::RemoveCurrent((BucketEntryIterator<JsUtil::BaseHashSet<Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Value_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
                           *)local_90);
        }
        JsUtil::
        BaseDictionary<Value_*,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
        ::
        BucketEntryIterator<JsUtil::BaseHashSet<Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Value_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
        ::MoveNext((BucketEntryIterator<JsUtil::BaseHashSet<Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Value_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
                    *)local_90);
        bVar2 = JsUtil::
                BaseDictionary<Value_*,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                ::
                BucketEntryIterator<JsUtil::BaseHashSet<Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Value_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
                ::IsValid((BucketEntryIterator<JsUtil::BaseHashSet<Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Value_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
                           *)local_90);
      } while (bVar2);
    }
  }
  return;
}

Assistant:

void
GlobOpt::ProcessValueKillsForLoopHeaderAfterBackEdgeMerge(BasicBlock *const block, GlobOptBlockData *const blockData)
{
    Assert(block);
    Assert(block->isLoopHeader);
    Assert(blockData);

    ValueSet *const valuesToKillOnCalls = blockData->valuesToKillOnCalls;
    if(valuesToKillOnCalls->Count() == 0)
    {
        return;
    }

    const JsArrayKills loopKills(block->loop->jsArrayKills);
    for(auto it = valuesToKillOnCalls->GetIteratorWithRemovalSupport(); it.IsValid(); it.MoveNext())
    {
        Value *const value = it.CurrentValue();
        ValueInfo *valueInfo = value->GetValueInfo();
        Assert(
            valueInfo->IsArrayOrObjectWithArray() ||
            valueInfo->IsOptimizedVirtualTypedArray() ||
            valueInfo->IsOptimizedTypedArray() && valueInfo->AsArrayValueInfo()->HeadSegmentLengthSym());

        const bool isJsArray = valueInfo->IsArrayOrObjectWithArray();
        Assert(!isJsArray == valueInfo->IsOptimizedTypedArray());

        const bool isVirtualTypedArray = valueInfo->IsOptimizedVirtualTypedArray();

        if((isJsArray || isVirtualTypedArray) ? loopKills.KillsValueType(valueInfo->Type()) : loopKills.KillsTypedArrayHeadSegmentLengths())
        {
            // Hoisting array checks and other related things for this type is disabled for the loop due to the kill, as
            // compensation code is currently not added on back-edges. When merging values from a back-edge, the array value
            // type cannot be definite, as that may require adding compensation code on the back-edge if the optimization pass
            // chooses to not optimize the array.
            if(isJsArray || isVirtualTypedArray)
            {
                ChangeValueType(nullptr, value, valueInfo->Type().ToLikely(), false);
            }
            else
            {
                ChangeValueInfo(
                    nullptr,
                    value,
                    valueInfo->AsArrayValueInfo()->Copy(alloc, true, false /* copyHeadSegmentLength */, true));
            }
            it.RemoveCurrent();
            continue;
        }

        if(!isJsArray || !valueInfo->IsArrayValueInfo())
        {
            continue;
        }

        // Similarly, if the loop contains an operation that kills JS array segments, don't make the segment or other related
        // syms available initially inside the loop
        ArrayValueInfo *const arrayValueInfo = valueInfo->AsArrayValueInfo();
        const bool removeHeadSegment = loopKills.KillsArrayHeadSegments() && arrayValueInfo->HeadSegmentSym();
        const bool removeHeadSegmentLength = loopKills.KillsArrayHeadSegmentLengths() && arrayValueInfo->HeadSegmentLengthSym();
        const bool removeLength = loopKills.KillsArrayLengths() && arrayValueInfo->LengthSym();
        if(removeHeadSegment || removeHeadSegmentLength || removeLength)
        {
            ChangeValueInfo(
                nullptr,
                value,
                arrayValueInfo->Copy(alloc, !removeHeadSegment, !removeHeadSegmentLength, !removeLength));
            valueInfo = value->GetValueInfo();
        }
    }
}